

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choker.cpp
# Opt level: O0

bool libtorrent::aux::anon_unknown_9::unchoke_compare_anti_leech
               (peer_connection *lhs,peer_connection *rhs)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  int local_2c;
  int local_28;
  int score2;
  int score1;
  int cmp;
  peer_connection *rhs_local;
  peer_connection *lhs_local;
  
  _score1 = rhs;
  rhs_local = lhs;
  score2 = compare_peers(lhs,rhs);
  if (score2 == 0) {
    local_28 = anti_leech_score(rhs_local);
    local_2c = anti_leech_score(_score1);
    if (local_28 == local_2c) {
      local_38.__d.__r = (duration)peer_connection::time_of_last_unchoke(rhs_local);
      local_40.__d.__r = (duration)peer_connection::time_of_last_unchoke(_score1);
      lhs_local._7_1_ = ::std::chrono::operator<(&local_38,&local_40);
    }
    else {
      lhs_local._7_1_ = local_2c < local_28;
    }
  }
  else {
    lhs_local._7_1_ = 0 < score2;
  }
  return lhs_local._7_1_;
}

Assistant:

bool unchoke_compare_anti_leech(peer_connection const* lhs
		, peer_connection const* rhs)
	{
		int const cmp = compare_peers(lhs, rhs);
		if (cmp != 0) return cmp > 0;

		int const score1 = anti_leech_score(lhs);
		int const score2 = anti_leech_score(rhs);
		if (score1 != score2) return score1 > score2;

		// prioritize the one that has waited the longest to be unchoked
		// the round-robin unchoker relies on this logic. Don't change it
		// without moving this into that unchoker logic
		return lhs->time_of_last_unchoke() < rhs->time_of_last_unchoke();
	}